

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_Neighbor_alltoallv
              (void *sendbuf,int *sendcounts,int *sdispls,MPIABI_Datatype senddtype,void *recvbuf,
              int *recvcounts,int *rdispls,MPIABI_Datatype recvtype,MPIABI_Comm comm)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  ompi_datatype_t *poVar4;
  ompi_datatype_t *poVar5;
  ompi_communicator_t *poVar6;
  WPI_Handle<ompi_communicator_t_*> local_50;
  WPI_Handle<ompi_datatype_t_*> local_48;
  WPI_Handle<ompi_datatype_t_*> local_40;
  int *local_38;
  int *recvcounts_local;
  void *recvbuf_local;
  MPIABI_Datatype senddtype_local;
  int *sdispls_local;
  int *sendcounts_local;
  void *sendbuf_local;
  
  local_38 = recvcounts;
  recvcounts_local = (int *)recvbuf;
  recvbuf_local = (void *)senddtype;
  senddtype_local = (MPIABI_Datatype)sdispls;
  sdispls_local = sendcounts;
  sendcounts_local = (int *)sendbuf;
  WPI_Handle<ompi_datatype_t_*>::WPI_Handle(&local_40,senddtype);
  poVar4 = WPI_Handle::operator_cast_to_ompi_datatype_t_((WPI_Handle *)&local_40);
  piVar2 = recvcounts_local;
  piVar1 = local_38;
  WPI_Handle<ompi_datatype_t_*>::WPI_Handle(&local_48,recvtype);
  poVar5 = WPI_Handle::operator_cast_to_ompi_datatype_t_((WPI_Handle *)&local_48);
  WPI_Handle<ompi_communicator_t_*>::WPI_Handle(&local_50,comm);
  poVar6 = WPI_Handle::operator_cast_to_ompi_communicator_t_((WPI_Handle *)&local_50);
  iVar3 = MPI_Neighbor_alltoallv
                    (sendbuf,sendcounts,sdispls,poVar4,piVar2,piVar1,rdispls,poVar5,poVar6);
  return iVar3;
}

Assistant:

int MPIABI_Neighbor_alltoallv(
  const void * sendbuf,
  const int * sendcounts,
  const int * sdispls,
  MPIABI_Datatype senddtype,
  void * recvbuf,
  const int * recvcounts,
  const int * rdispls,
  MPIABI_Datatype recvtype,
  MPIABI_Comm comm
) {
  return MPI_Neighbor_alltoallv(
    sendbuf,
    sendcounts,
    sdispls,
    (MPI_Datatype)(WPI_Datatype)senddtype,
    recvbuf,
    recvcounts,
    rdispls,
    (MPI_Datatype)(WPI_Datatype)recvtype,
    (MPI_Comm)(WPI_Comm)comm
  );
}